

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TSymbol::dumpExtensions(TSymbol *this,TInfoSink *infoSink)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TInfoSinkBase *this_00;
  ulong uVar3;
  
  uVar1 = (*this->_vptr_TSymbol[0x11])();
  if (uVar1 != 0) {
    this_00 = &infoSink->debug;
    TInfoSinkBase::append(this_00," <");
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        iVar2 = (*this->_vptr_TSymbol[0x12])(this);
        TInfoSinkBase::append(this_00,*(char **)(CONCAT44(extraout_var,iVar2) + uVar3 * 8));
        TInfoSinkBase::append(this_00,",");
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    TInfoSinkBase::append(this_00,">");
    return;
  }
  return;
}

Assistant:

void TSymbol::dumpExtensions(TInfoSink& infoSink) const
{
    int numExtensions = getNumExtensions();
    if (numExtensions) {
        infoSink.debug << " <";

        for (int i = 0; i < numExtensions; i++)
            infoSink.debug << getExtensions()[i] << ",";

        infoSink.debug << ">";
    }
}